

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

void __thiscall
libtorrent::resolver::async_resolve(resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  io_context *piVar1;
  bool bVar2;
  pointer ppVar3;
  bool local_309;
  resolver *local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  type local_2e0;
  resolver *local_288;
  code *local_280;
  undefined8 local_278;
  type local_270;
  undefined1 local_214;
  uchar local_213;
  bitfield_flag local_212;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1f0 [8];
  query q;
  undefined1 local_153;
  uchar local_152;
  bitfield_flag local_151;
  anon_class_80_4_6b615590_for_handler_ local_150;
  undefined1 local_100 [8];
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_e0;
  undefined1 local_d3;
  uchar local_d2;
  bitfield_flag local_d1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  local_d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  local_c8;
  iterator i;
  anon_class_88_4_ebb20b7f_for_handler_ local_b0;
  undefined1 local_58 [8];
  address ip;
  error_code ec;
  callback_t *h_local;
  string *host_local;
  resolver *this_local;
  resolver_flags flags_local;
  
  boost::system::error_code::error_code((error_code *)&ip.ipv6_address_.scope_id_);
  boost::asio::ip::make_address((address *)local_58,host,(error_code *)&ip.ipv6_address_.scope_id_);
  bVar2 = boost::system::error_code::operator_cast_to_bool
                    ((error_code *)&ip.ipv6_address_.scope_id_);
  if (bVar2) {
    boost::system::error_code::clear((error_code *)&ip.ipv6_address_.scope_id_);
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
         ::find(&this->m_cache,host);
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
         ::end(&this->m_cache);
    bVar2 = std::__detail::operator!=(&local_c8,&local_d0);
    if (bVar2) {
      local_d3 = 1;
      local_d2 = flags.m_val;
      local_d1 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::resolver_flag_tag,_void>)
                            flags.m_val,
                            (bitfield_flag<unsigned_char,_libtorrent::resolver_flag_tag,_void>)0x1);
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_d1);
      local_309 = true;
      if (!bVar2) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                               *)&local_c8);
        local_e0 = std::chrono::operator+(&(ppVar3->second).last_seen,&this->m_timeout);
        ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)libtorrent::aux::time_now();
        local_309 = std::chrono::operator>=
                              (&local_e0,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&ips.
                                   super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (local_309 != false) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                               *)&local_c8);
        std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                  ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                   local_100,&(ppVar3->second).addresses);
        piVar1 = this->m_ios;
        local_150.this = this;
        std::
        function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
        ::function(&local_150.h,h);
        local_150.ec.val_ = (undefined4)ip.ipv6_address_.scope_id_;
        local_150.ec.failed_ = (bool)ip.ipv6_address_.scope_id_._4_1_;
        local_150.ec._5_3_ = ip.ipv6_address_.scope_id_._5_3_;
        std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                  (&local_150.ips,
                   (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                   local_100);
        boost::asio::io_context::
        post<libtorrent::resolver::async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)::__1>
                  (piVar1,&local_150);
        async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)
        ::$_1::~__1((__1 *)&local_150);
        std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::~vector
                  ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                   local_100);
        return;
      }
    }
    local_153 = 1;
    local_152 = flags.m_val;
    local_151 = (bitfield_flag)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_char,_libtorrent::resolver_flag_tag,_void>)
                           flags.m_val,
                           (bitfield_flag<unsigned_char,_libtorrent::resolver_flag_tag,_void>)0x1);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_151);
    if (bVar2) {
      piVar1 = this->m_ios;
      q.service_name_.field_2._8_8_ = this;
      std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)&stack0xfffffffffffffe88,h);
      boost::asio::io_context::
      post<libtorrent::resolver::async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)::__2>
                (piVar1,(anon_class_40_2_fd512dd5_for_handler_ *)
                        ((long)&q.service_name_.field_2 + 8));
      async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)
      ::$_2::~__2((__2 *)(q.service_name_.field_2._M_local_buf + 8));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"80",&local_211);
      boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
                ((basic_resolver_query<boost::asio::ip::tcp> *)local_1f0,host,&local_210,
                 address_configured);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      local_214 = 2;
      local_213 = flags.m_val;
      local_212 = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::resolver_flag_tag,_void>)
                             flags.m_val,
                             (bitfield_flag<unsigned_char,_libtorrent::resolver_flag_tag,_void>)0x2)
      ;
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_212);
      if (bVar2) {
        local_280 = on_lookup;
        local_278 = 0;
        local_288 = this;
        std::
        bind<void(libtorrent::resolver::*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&),libtorrent::resolver*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&>
                  (&local_270,(offset_in_resolver_to_subr *)&local_280,&local_288,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2,h,host);
        boost::asio::ip::
        basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
        ::
        async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>>
                  ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                    *)&this->m_resolver,(query *)local_1f0,&local_270);
        std::
        _Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~_Bind(&local_270);
      }
      else {
        local_2f0 = on_lookup;
        local_2e8 = 0;
        local_2f8 = this;
        std::
        bind<void(libtorrent::resolver::*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&),libtorrent::resolver*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&>
                  (&local_2e0,(offset_in_resolver_to_subr *)&local_2f0,&local_2f8,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2,h,host);
        boost::asio::ip::
        basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
        ::
        async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>>
                  ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                    *)&this->m_critical_resolver,(query *)local_1f0,&local_2e0);
        std::
        _Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~_Bind(&local_2e0);
      }
      boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query
                ((basic_resolver_query<boost::asio::ip::tcp> *)local_1f0);
    }
  }
  else {
    piVar1 = this->m_ios;
    local_b0.this = this;
    std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function(&local_b0.h,h);
    local_b0.ec.val_ = (undefined4)ip.ipv6_address_.scope_id_;
    local_b0.ec.failed_ = (bool)ip.ipv6_address_.scope_id_._4_1_;
    local_b0.ec._5_3_ = ip.ipv6_address_.scope_id_._5_3_;
    boost::asio::ip::address::address(&local_b0.ip,(address *)local_58);
    boost::asio::io_context::
    post<libtorrent::resolver::async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)::__0>
              (piVar1,&local_b0);
    async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&)
    ::$_0::~__0((__0 *)&local_b0);
  }
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t const& h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			m_ios.post([=]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= aux::time_now())
			{
				std::vector<address> ips = i->second.addresses;
				m_ios.post([=] { callback(h, ec, ips); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			m_ios.post([=] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		// the port is ignored
		tcp::resolver::query const q(host, "80");

		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
		else
		{
			m_critical_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
	}